

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

charcount_t Js::FunctionBody::SkipByteOrderMark(LPCUTF8 *documentStart)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  charcount_t local_14;
  charcount_t retValue;
  LPCUTF8 *documentStart_local;
  
  local_14 = 0;
  if (*documentStart == (LPCUTF8)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0xa59,"(documentStart != nullptr)","documentStart != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (((**documentStart == 0xef) && ((*documentStart)[1] == 0xbb)) && ((*documentStart)[2] == 0xbf))
  {
    *documentStart = *documentStart + 3;
    local_14 = 1;
  }
  else if (((**documentStart == 0xff) && ((*documentStart)[1] == 0xfe)) ||
          ((**documentStart == 0xfe && ((*documentStart)[1] == 0xff)))) {
    *documentStart = *documentStart + 2;
    local_14 = 1;
  }
  return local_14;
}

Assistant:

static charcount_t SkipByteOrderMark(__in_bcount_z(4) LPCUTF8& documentStart)
        {
            charcount_t retValue = 0;

            Assert(documentStart != nullptr);

            if (documentStart[0] == 0xEF &&
                documentStart[1] == 0xBB &&
                documentStart[2] == 0xBF)
            {
                // UTF-8     - EF BB BF
                // 3 bytes skipped - reports one char skipped
                documentStart += 3;
                retValue = 1;
            }
            else if ((documentStart[0] == 0xFF && documentStart[1] == 0xFE) ||
                    (documentStart[0] == 0xFE && documentStart[1] == 0xFF))
            {
                // UTF-16 LE - FF FE
                // UTF-16 BE - FE FF
                // 2 bytes skipped - reports one char skipped
                documentStart += 2;
                retValue = 1;
            }

            return retValue;
        }